

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O2

char * kstrtok(char *str,char *sep,ks_tokaux_t *aux)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  if (sep == (char *)0x0) {
    if (aux->finished != 0) {
      return (char *)0x0;
    }
  }
  else {
    if ((str == (char *)0x0) && ((aux->tab[0] & 1) != 0)) {
      return (char *)0x0;
    }
    aux->finished = 0;
    if (sep[1] == '\0') {
      aux->sep = (int)*sep;
    }
    else {
      aux->sep = -1;
      aux->tab[0] = 0;
      aux->tab[1] = 0;
      aux->tab[2] = 0;
      aux->tab[3] = 0;
      while( true ) {
        bVar2 = *sep;
        if (bVar2 == 0) break;
        aux->tab[(int)(char)bVar2 >> 6] = aux->tab[(int)(char)bVar2 >> 6] | 1L << (bVar2 & 0x3f);
        sep = (char *)((byte *)sep + 1);
      }
    }
  }
  if (str != (char *)0x0) {
    aux->p = str + -1;
    aux->finished = 0;
  }
  pcVar5 = aux->p + 1;
  pcVar3 = pcVar5;
  pcVar4 = aux->p;
  if (aux->sep < 0) {
    while( true ) {
      uVar6 = (uint)*pcVar5;
      if ((uVar6 == 0) || ((aux->tab[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0)) break;
      pcVar5 = pcVar5 + 1;
    }
  }
  else {
    do {
      pcVar1 = pcVar4 + 1;
      pcVar5 = pcVar4 + 1;
      if (*pcVar1 == '\0') break;
      pcVar4 = pcVar5;
    } while (aux->sep != (int)*pcVar1);
  }
  aux->p = pcVar5;
  if (*pcVar5 != '\0') {
    return pcVar3;
  }
  aux->finished = 1;
  return pcVar3;
}

Assistant:

char *kstrtok(const char *str, const char *sep, ks_tokaux_t *aux)
{
	const char *p, *start;
	if (sep) { // set up the table
		if (str == 0 && (aux->tab[0]&1)) return 0; // no need to set up if we have finished
		aux->finished = 0;
		if (sep[1]) {
			aux->sep = -1;
			aux->tab[0] = aux->tab[1] = aux->tab[2] = aux->tab[3] = 0;
			for (p = sep; *p; ++p) aux->tab[*p>>6] |= 1ull<<(*p&0x3f);
		} else aux->sep = sep[0];
	}
	if (aux->finished) return 0;
	else if (str) aux->p = str - 1, aux->finished = 0;
	if (aux->sep < 0) {
		for (p = start = aux->p + 1; *p; ++p)
			if (aux->tab[*p>>6]>>(*p&0x3f)&1) break;
	} else {
		for (p = start = aux->p + 1; *p; ++p)
			if (*p == aux->sep) break;
	}
	aux->p = p; // end of token
	if (*p == 0) aux->finished = 1; // no more tokens
	return (char*)start;
}